

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O0

void __thiscall
ApprovalTests::Windows::AraxisMergeReporter::AraxisMergeReporter(AraxisMergeReporter *this)

{
  DiffInfo *in_RDI;
  DiffInfo *in_stack_ffffffffffffffd8;
  GenericDiffReporter *in_stack_ffffffffffffffe0;
  
  DiffPrograms::Windows::ARAXIS_MERGE();
  GenericDiffReporter::GenericDiffReporter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DiffInfo::~DiffInfo(in_RDI);
  *(undefined ***)&in_RDI->program = &PTR__AraxisMergeReporter_001c33e0;
  return;
}

Assistant:

AraxisMergeReporter::AraxisMergeReporter()
            : GenericDiffReporter(DiffPrograms::Windows::ARAXIS_MERGE())
        {
        }